

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

int __thiscall sptk::swipe::maxv(swipe *this,vector yr_vector)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  if (0 < (int)this) {
    uVar2 = 0xffffffff;
    dVar4 = -32768.0;
    uVar3 = 0;
    do {
      dVar1 = *(double *)(yr_vector._0_8_ + uVar3 * 8);
      if (dVar4 < dVar1) {
        uVar2 = uVar3 & 0xffffffff;
        dVar4 = dVar1;
      }
      uVar3 = uVar3 + 1;
    } while (((ulong)this & 0xffffffff) != uVar3);
    return (int)uVar2;
  }
  return -1;
}

Assistant:

int maxv(vector yr_vector) {
    int index = -1;
    double val = SHRT_MIN;
    int i;
    for (i = 0; i < yr_vector.x; i++) {
        if (yr_vector.v[i] > val) {
            val = yr_vector.v[i];
            index = i;
        }
    }
    return(index);
}